

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O0

void print_tree_comp(FILE *fp,char *label,dtree_node_t *node,pset_t *pset,uint32 lvl)

{
  char local_2d;
  char i;
  uint32 lvl_local;
  pset_t *pset_local;
  dtree_node_t *node_local;
  char *label_local;
  FILE *fp_local;
  
  fprintf((FILE *)fp,"%s",label);
  for (local_2d = '\0'; (uint)(int)local_2d < lvl << 2; local_2d = local_2d + '\x01') {
    putc(0x20,(FILE *)fp);
  }
  fprintf((FILE *)fp,"( ");
  print_node_comp(fp,node,pset);
  if ((node->y != (dtree_node_str *)0x0) && (node->n != (dtree_node_str *)0x0)) {
    fprintf((FILE *)fp,"\n");
    print_tree_comp(fp,label,node->y,pset,lvl + 1);
    fprintf((FILE *)fp,"\n");
    print_tree_comp(fp,label,node->n,pset,lvl + 1);
  }
  fprintf((FILE *)fp,")");
  return;
}

Assistant:

void
print_tree_comp(FILE *fp,
		char *label,
		dtree_node_t *node,
		pset_t *pset,
		uint32 lvl)
{
    char i;

    fprintf(fp, "%s", label);
    for (i = 0; i < lvl*4; i++) {
	putc(' ', fp);
    }

    fprintf(fp, "( ");

    print_node_comp(fp, node, pset);

    if (node->y && node->n) {
	fprintf(fp, "\n");
	print_tree_comp(fp, label, node->y, pset, lvl+1);

	fprintf(fp, "\n");
	print_tree_comp(fp, label, node->n, pset, lvl+1);
    }

    fprintf(fp, ")");
}